

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::HeapType::getHeapTypeChildren
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapType *this)

{
  value_type local_58;
  undefined1 auStack_48 [8];
  HeapTypeChildCollector collector;
  
  collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
  super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>.taskList.
  super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
  super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>.taskList.
  super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
  super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>.taskList.
  super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
  isTopLevel = false;
  collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>._25_7_ =
       0;
  collector.children.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  collector.children.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.kind = ScanHeapType;
  local_58.field_1 = (anon_union_8_2_a60233d5_for_Task_2)this;
  std::
  vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
               *)auStack_48,&local_58);
  anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::doWalk
            ((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)auStack_48)
  ;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            (__return_storage_ptr__,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &collector.
              super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
              isTopLevel);
  if (collector.super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
      _24_8_ != 0) {
    operator_delete((void *)collector.
                            super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                            ._24_8_,
                    (long)collector.children.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    collector.
                    super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
                    _24_8_);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)collector.
                          super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                          .
                          super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                          .taskList.
                          super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> HeapType::getHeapTypeChildren() const {
  HeapTypeChildCollector collector;
  collector.walkRoot(const_cast<HeapType*>(this));
  return collector.children;
}